

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Worker::Run(Worker *this)

{
  _Rb_tree_header *p_Var1;
  ostringstream *poVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  CURLMcode err;
  long lVar6;
  long lVar7;
  int *piVar8;
  LogManager *pLVar9;
  ostream *poVar10;
  char *__s;
  size_t sVar11;
  ssize_t sVar12;
  CurlException *this_00;
  _Base_ptr p_Var13;
  int iVar14;
  byte bVar15;
  byte bVar16;
  const_iterator __position;
  ulong uVar17;
  int transfers_running;
  int maxfd;
  long sleep_duration;
  int numLeft;
  lock_t lock;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_38c;
  undefined1 local_385;
  int local_384;
  long local_380;
  undefined4 local_374;
  pthread_mutex_t *local_370;
  long local_368;
  map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
  *local_360;
  fd_set local_358;
  string local_2d8;
  fd_set local_2b8;
  fd_set local_238;
  Log local_1b0;
  
  local_38c = -1;
  local_358.fds_bits[0xe] = 0;
  local_358.fds_bits[0xf] = 0;
  local_358.fds_bits[0xc] = 0;
  local_358.fds_bits[0xd] = 0;
  local_358.fds_bits[10] = 0;
  local_358.fds_bits[0xb] = 0;
  local_358.fds_bits[8] = 0;
  local_358.fds_bits[9] = 0;
  local_358.fds_bits[6] = 0;
  local_358.fds_bits[7] = 0;
  local_358.fds_bits[4] = 0;
  local_358.fds_bits[5] = 0;
  local_358.fds_bits[2] = 0;
  local_358.fds_bits[3] = 0;
  local_358.fds_bits[0] = 0;
  local_358.fds_bits[1] = 0;
  local_238.fds_bits[0xe] = 0;
  local_238.fds_bits[0xf] = 0;
  local_238.fds_bits[0xc] = 0;
  local_238.fds_bits[0xd] = 0;
  local_238.fds_bits[10] = 0;
  local_238.fds_bits[0xb] = 0;
  local_238.fds_bits[8] = 0;
  local_238.fds_bits[9] = 0;
  local_238.fds_bits[6] = 0;
  local_238.fds_bits[7] = 0;
  local_238.fds_bits[4] = 0;
  local_238.fds_bits[5] = 0;
  local_238.fds_bits[2] = 0;
  local_238.fds_bits[3] = 0;
  local_238.fds_bits[0] = 0;
  local_238.fds_bits[1] = 0;
  local_2b8.fds_bits[0xe] = 0;
  local_2b8.fds_bits[0xf] = 0;
  local_2b8.fds_bits[0xc] = 0;
  local_2b8.fds_bits[0xd] = 0;
  local_2b8.fds_bits[10] = 0;
  local_2b8.fds_bits[0xb] = 0;
  local_2b8.fds_bits[8] = 0;
  local_2b8.fds_bits[9] = 0;
  local_2b8.fds_bits[6] = 0;
  local_2b8.fds_bits[7] = 0;
  local_2b8.fds_bits[4] = 0;
  local_2b8.fds_bits[5] = 0;
  local_2b8.fds_bits[2] = 0;
  local_2b8.fds_bits[3] = 0;
  local_2b8.fds_bits[0] = 0;
  local_2b8.fds_bits[1] = 0;
  lVar6 = std::chrono::_V2::steady_clock::now();
  bVar4 = EvaluateState(this,true,true);
  if (bVar4) {
    lVar6 = lVar6 + 60000000000;
    local_360 = &this->ongoing_;
    p_Var1 = &(this->ongoing_)._M_t._M_impl.super__Rb_tree_header;
    local_370 = (pthread_mutex_t *)&this->mutex_;
    bVar16 = 1;
    do {
      if ((bVar16 & 1) != 0) {
        Dequeue(this);
      }
      iVar5 = local_38c;
      curl_multi_perform(this->handle_,&local_38c);
      if ((local_38c == 0) && (iVar5 == -1)) {
        local_38c = -1;
LAB_0011bb93:
        lVar7 = std::chrono::_V2::steady_clock::now();
        if (lVar6 < lVar7) {
          pLVar9 = logfault::LogManager::Instance();
          if (((pLVar9->handlers_).
               super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (pLVar9->handlers_).
               super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) && (4 < (int)pLVar9->level_)) {
            poVar2 = &local_1b0.out_;
            local_1b0.level_ = 5;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"restincurl: ",0xc)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"Idle timeout. Will shut down the worker-thread.",0x2f);
            logfault::Log::~Log(&local_1b0);
          }
          break;
        }
      }
      else {
        if (local_38c < 1) goto LAB_0011bb93;
        lVar6 = std::chrono::_V2::steady_clock::now();
        lVar6 = lVar6 + 60000000000;
      }
      local_374 = 0;
      local_368 = lVar6;
      piVar8 = (int *)curl_multi_info_read(this->handle_,&local_374);
      while (piVar8 != (int *)0x0) {
        p_Var13 = (this->ongoing_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var13 == (_Base_ptr)0x0) {
LAB_0011c18e:
          pLVar9 = logfault::LogManager::Instance();
          if (((pLVar9->handlers_).
               super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (pLVar9->handlers_).
               super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) && (4 < (int)pLVar9->level_)) {
            poVar2 = &local_1b0.out_;
            local_1b0.level_ = 5;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"restincurl: ",0xc)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"Failed to find easy_handle in ongoing!",0x26);
            logfault::Log::~Log(&local_1b0);
          }
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                        ,0x3ed,"void restincurl::Worker::Run()");
        }
        uVar17 = *(ulong *)(piVar8 + 2);
        __position._M_node = &p_Var1->_M_header;
        do {
          if (*(ulong *)(p_Var13 + 1) >= uVar17) {
            __position._M_node = p_Var13;
          }
          p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uVar17];
        } while (p_Var13 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)__position._M_node == p_Var1) ||
           (uVar17 < *(ulong *)(__position._M_node + 1))) goto LAB_0011c18e;
        pLVar9 = logfault::LogManager::Instance();
        if (((pLVar9->handlers_).
             super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pLVar9->handlers_).
             super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) && (4 < (int)pLVar9->level_)) {
          local_1b0.level_ = 5;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.out_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.out_,"restincurl: ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.out_,"Finishing request with easy-handle: ",0x24);
          if (*(long *)__position._M_node[1]._M_parent == 0) goto LAB_0011c20d;
          poVar10 = std::ostream::_M_insert<void_const*>(&local_1b0.out_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"; with result: ",0xf);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,piVar8[4]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," expl: \'",8);
          __s = (char *)curl_easy_strerror(piVar8[4]);
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
          }
          else {
            sVar11 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'; with msg: ",0xd);
          std::ostream::operator<<((ostream *)poVar10,*piVar8);
          logfault::Log::~Log(&local_1b0);
        }
        Request::CallCompletion((Request *)__position._M_node[1]._M_parent,piVar8[4]);
        if (*piVar8 == 1) {
          curl_multi_remove_handle(this->handle_,*(undefined8 *)(piVar8 + 2));
        }
        if (*(EasyHandle **)__position._M_node[1]._M_parent == (EasyHandle *)0x0) {
LAB_0011c20d:
          __assert_fail("eh_",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                        ,0x1fb,"EasyHandle &restincurl::Request::GetEasyHandle()");
        }
        EasyHandle::Close(*(EasyHandle **)__position._M_node[1]._M_parent);
        std::
        _Rb_tree<void_*,_std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>,_std::_Select1st<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
        ::_M_erase_aux(&local_360->_M_t,__position);
        piVar8 = (int *)curl_multi_info_read(this->handle_,&local_374);
      }
      iVar5 = pthread_mutex_lock(local_370);
      lVar6 = local_368;
      if (iVar5 != 0) goto LAB_0011c22c;
      if ((this->abort_ != false) || ((local_38c == 0 && (this->close_pending_ == true)))) {
        pthread_mutex_unlock(local_370);
        break;
      }
      pthread_mutex_unlock(local_370);
      lVar7 = std::chrono::_V2::steady_clock::now();
      local_380 = (lVar6 - lVar7) / 1000000;
      if (local_380 < 2) {
        local_380 = 1;
      }
      local_358.fds_bits[0] = 0;
      local_358.fds_bits[1] = 0;
      local_358.fds_bits[2] = 0;
      local_358.fds_bits[3] = 0;
      local_358.fds_bits[4] = 0;
      local_358.fds_bits[5] = 0;
      local_358.fds_bits[6] = 0;
      local_358.fds_bits[7] = 0;
      local_358.fds_bits[8] = 0;
      local_358.fds_bits[9] = 0;
      local_358.fds_bits[10] = 0;
      local_358.fds_bits[0xb] = 0;
      local_358.fds_bits[0xc] = 0;
      local_358.fds_bits[0xd] = 0;
      local_358.fds_bits[0xe] = 0;
      local_358.fds_bits[0xf] = 0;
      local_238.fds_bits[0] = 0;
      local_238.fds_bits[1] = 0;
      local_238.fds_bits[2] = 0;
      local_238.fds_bits[3] = 0;
      local_238.fds_bits[4] = 0;
      local_238.fds_bits[5] = 0;
      local_238.fds_bits[6] = 0;
      local_238.fds_bits[7] = 0;
      local_238.fds_bits[8] = 0;
      local_238.fds_bits[9] = 0;
      local_238.fds_bits[10] = 0;
      local_238.fds_bits[0xb] = 0;
      local_238.fds_bits[0xc] = 0;
      local_238.fds_bits[0xd] = 0;
      local_238.fds_bits[0xe] = 0;
      local_238.fds_bits[0xf] = 0;
      local_2b8.fds_bits[0xe] = 0;
      local_2b8.fds_bits[0xf] = 0;
      local_2b8.fds_bits[0xc] = 0;
      local_2b8.fds_bits[0xd] = 0;
      local_2b8.fds_bits[10] = 0;
      local_2b8.fds_bits[0xb] = 0;
      local_2b8.fds_bits[8] = 0;
      local_2b8.fds_bits[9] = 0;
      local_2b8.fds_bits[6] = 0;
      local_2b8.fds_bits[7] = 0;
      local_2b8.fds_bits[4] = 0;
      local_2b8.fds_bits[5] = 0;
      local_2b8.fds_bits[2] = 0;
      local_2b8.fds_bits[3] = 0;
      local_2b8.fds_bits[0] = 0;
      local_2b8.fds_bits[1] = 0;
      local_384 = -1;
      iVar5 = -1;
      if (0 < local_38c) {
        curl_multi_timeout(this->handle_,&local_380);
        if (local_380 < 0) {
          local_380 = 1000;
        }
        err = curl_multi_fdset(this->handle_,&local_358,&local_238,&local_2b8,&local_384);
        if (err != CURLM_OK) goto LAB_0011c233;
        iVar5 = local_384;
        if (local_384 == -1) {
          local_380 = 0x32;
          iVar5 = -1;
        }
      }
      local_1b0._0_8_ = local_380 / 1000;
      local_1b0._8_8_ = (local_380 % 1000) * 1000;
      iVar3 = (this->signal_).pipefd_._M_elems[0];
      iVar14 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar14 = iVar3;
      }
      uVar17 = 1L << ((byte)iVar3 & 0x3f);
      local_358.fds_bits[iVar14 >> 6] = local_358.fds_bits[iVar14 >> 6] | uVar17;
      if (iVar5 < iVar3) {
        iVar5 = iVar3;
      }
      local_384 = iVar5 + 1;
      iVar5 = select(local_384,&local_358,&local_238,&local_2b8,(timeval *)&local_1b0);
      if ((iVar5 < 1) || ((local_358.fds_bits[iVar14 >> 6] & uVar17) == 0)) {
        bVar15 = 0;
      }
      else {
        local_385 = 0;
        bVar16 = 0;
        do {
          bVar15 = bVar16;
          sVar12 = read((this->signal_).pipefd_._M_elems[0],&local_385,1);
          bVar16 = 1;
        } while (0 < sVar12);
      }
      bVar16 = bVar15 | this->pending_entries_in_queue_;
      bVar4 = EvaluateState(this,local_38c != 0,
                            (bool)(bVar15 | this->pending_entries_in_queue_ & 1U));
    } while (bVar4);
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar5 == 0) {
    if ((this->close_pending_ != false) || (this->abort_ == true)) {
      this->done_ = true;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
LAB_0011c22c:
  err = std::__throw_system_error(iVar5);
LAB_0011c233:
  this_00 = (CurlException *)__cxa_allocate_exception(0x18);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"curl_multi_fdset","");
  CurlException::CurlException(this_00,&local_2d8,err);
  __cxa_throw(this_00,&CurlException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Run() {
            int transfers_running = -1;
            fd_set fdread = {};
            fd_set fdwrite = {};
            fd_set fdexcep = {};
            bool do_dequeue = true;
            auto timeout = GetNextTimeout();

            while (EvaluateState(transfers_running, do_dequeue)) {

                if (do_dequeue) {
                    Dequeue();
                    do_dequeue = false;
                }

                /* timeout or readable/writable sockets */
                const bool initial_ideling = transfers_running == -1;
                curl_multi_perform(handle_, &transfers_running);
                if ((transfers_running == 0) && initial_ideling) {
                    transfers_running = -1; // Let's ignore close_pending_ until we have seen a request
                }

                // Shut down the thread if we have been idling too long
                if (transfers_running <= 0) {
                    if (timeout < std::chrono::steady_clock::now()) {
                        RESTINCURL_LOG("Idle timeout. Will shut down the worker-thread.");
                        break;
                    }
                } else {
                    timeout = GetNextTimeout();
                }

                int numLeft = {};
                while (auto m = curl_multi_info_read(handle_, &numLeft)) {
                    assert(m);
                    auto it = ongoing_.find(m->easy_handle);
                    if (it != ongoing_.end()) {
                        RESTINCURL_LOG("Finishing request with easy-handle: "
                            << (EasyHandle::handle_t)it->second->GetEasyHandle()
                            << "; with result: " << m->data.result << " expl: '" << curl_easy_strerror(m->data.result)
                            << "'; with msg: " << m->msg);

                        try {
                            it->second->Complete(m->data.result, m->msg);
                        } catch(const std::exception& ex) {
                            RESTINCURL_LOG("Complete threw: " << ex.what());
                        }
                        if (m->msg == CURLMSG_DONE) {
                            curl_multi_remove_handle(handle_, m->easy_handle);
                        }
                        it->second->GetEasyHandle().Close();
                        ongoing_.erase(it);
                    } else {
                        RESTINCURL_LOG("Failed to find easy_handle in ongoing!");
                        assert(false);
                    }
                }

                {
                    lock_t lock(mutex_);
                    // Avoid using select() as a timer when we need to exit anyway
                    if (abort_ || (!transfers_running && close_pending_)) {
                        break;
                    }
                }

                auto next_timeout = std::chrono::duration_cast<std::chrono::milliseconds>(
                    timeout - std::chrono::steady_clock::now());
                long sleep_duration = std::max<long>(1, next_timeout.count());
                /* extract sleep_duration value */


                FD_ZERO(&fdread);
                FD_ZERO(&fdwrite);
                FD_ZERO(&fdexcep);

                int maxfd = -1;
                if (transfers_running > 0) {
                    curl_multi_timeout(handle_, &sleep_duration);
                    if (sleep_duration < 0) {
                        sleep_duration = 1000;
                    }

                    /* get file descriptors from the transfers */
                    const auto mc = curl_multi_fdset(handle_, &fdread, &fdwrite, &fdexcep, &maxfd);
                    RESTINCURL_LOG_TRACE("maxfd: " << maxfd);
                    if (mc != CURLM_OK) {
                        throw CurlException("curl_multi_fdset", mc);
                    }

                    if (maxfd == -1) {
                        // Curl want's us to revisit soon
                        sleep_duration = 50;
                    }
                } // active transfers

                struct timeval tv = {};
                tv.tv_sec = sleep_duration / 1000;
                tv.tv_usec = (sleep_duration % 1000) * 1000;

                const auto signalfd = signal_.GetReadFd();

                RESTINCURL_LOG_TRACE("Calling select() with timeout of "
                    << sleep_duration
                    << " ms. Next timeout in " << next_timeout.count() << " ms. "
                    << transfers_running << " active transfers.");

                FD_SET(signalfd, &fdread);
                maxfd = std::max(signalfd,  maxfd) + 1;

                const auto rval = select(maxfd, &fdread, &fdwrite, &fdexcep, &tv);
                RESTINCURL_LOG_TRACE("select(" << maxfd << ") returned: " << rval);

                if (rval > 0) {
                    if (FD_ISSET(signalfd, &fdread)) {
                        RESTINCURL_LOG_TRACE("FD_ISSET was true: ");
                        do_dequeue = signal_.WasSignalled();
                    }

                }
                if (pending_entries_in_queue_) {
                    do_dequeue = true;
                }
            } // loop


            lock_t lock(mutex_);
            if (close_pending_ || abort_) {
                done_ = true;
            }
        }